

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::NetworkAddressImpl::connectAuthenticated(NetworkAddressImpl *this)

{
  NetworkFilter *filter;
  SocketAddress *pSVar1;
  long in_RSI;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> AVar2;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs;
  undefined1 local_48 [8];
  Promise<kj::AuthenticatedStream> promise;
  undefined1 local_30 [8];
  Array<kj::(anonymous_namespace)::SocketAddress> addrsCopy;
  NetworkAddressImpl *this_local;
  
  _promise = Array<kj::(anonymous_namespace)::SocketAddress>::asPtr
                       ((Array<kj::(anonymous_namespace)::SocketAddress> *)(in_RSI + 0x18));
  heapArray<kj::(anonymous_namespace)::SocketAddress>
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)local_30,_promise);
  filter = *(NetworkFilter **)(in_RSI + 8);
  pSVar1 = *(SocketAddress **)(in_RSI + 0x10);
  AVar2 = kj::Array::operator_cast_to_ArrayPtr((Array *)local_30);
  addrs.size_ = (size_t)AVar2.ptr;
  addrs.ptr = pSVar1;
  connectImpl((LowLevelAsyncIoProvider *)local_48,filter,addrs,AVar2.size_._0_1_);
  mv<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)local_30);
  Promise<kj::AuthenticatedStream>::attach<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Promise<kj::AuthenticatedStream> *)this,
             (Array<kj::(anonymous_namespace)::SocketAddress> *)local_48);
  Promise<kj::AuthenticatedStream>::~Promise((Promise<kj::AuthenticatedStream> *)local_48);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array
            ((Array<kj::(anonymous_namespace)::SocketAddress> *)local_30);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> connectAuthenticated() override {
    auto addrsCopy = heapArray(addrs.asPtr());
    auto promise = connectImpl(lowLevel, filter, addrsCopy, true);
    return promise.attach(kj::mv(addrsCopy));
  }